

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_errors.hpp
# Opt level: O3

void Fossilize::log_error_pnext_chain(string *what,void *pNext)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint __len;
  long *in_FS_OFFSET;
  string __str;
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::append((char *)what);
  if (pNext == (void *)0x0) {
LAB_001296d1:
    std::__cxx11::string::append((char *)what);
    if ((*(int *)(*in_FS_OFFSET + -0x18) < 2) &&
       (bVar3 = Internal::log_thread_callback(LOG_DEFAULT,"%s\n",(what->_M_dataplus)._M_p), !bVar3))
    {
      log_error_pnext_chain();
    }
    return;
  }
  do {
    uVar1 = *pNext;
    __val = -uVar1;
    if (0 < (int)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar5 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar4 = (uint)uVar5;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_00129652;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_00129652;
        }
        if (uVar4 < 10000) goto LAB_00129652;
        uVar5 = uVar5 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar4);
      __len = __len + 1;
    }
LAB_00129652:
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_50[0] + (ulong)(uVar1 >> 0x1f)),__len,__val);
    std::__cxx11::string::_M_append((char *)what,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    pNext = *(void **)((long)pNext + 8);
    if ((uint *)pNext == (uint *)0x0) goto LAB_001296d1;
    std::__cxx11::string::append((char *)what);
  } while( true );
}

Assistant:

static inline void log_error_pnext_chain(std::string what, const void *pNext)
{
	what += " (pNext->sType chain: [";
	while (pNext != nullptr)
	{
		auto *next = static_cast<const VkBaseInStructure *>(pNext);
		what += std::to_string(next->sType);
		pNext = next->pNext;
		if (pNext != nullptr)
			what += ", ";
	}
	what += "])";
	LOGW_LEVEL("%s\n", what.c_str());
}